

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_barrier.cpp
# Opt level: O0

int __thiscall SharedBarrier::init(SharedBarrier *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ContextManager *pCVar2;
  pointer this_00;
  anon_union_32_2_0a46039b *__barrier;
  string local_a8;
  string local_88;
  string local_68;
  string local_38;
  pthread_barrierattr_t local_18;
  uint local_14;
  pthread_barrierattr_t barrierattr;
  uint32_t count_local;
  SharedBarrier *this_local;
  
  local_14 = (uint)ctx;
  _barrierattr = this;
  iVar1 = pthread_barrierattr_init(&local_18);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_38,"Failed to initialize barrierattr: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  iVar1 = pthread_barrierattr_setpshared(&local_18,1);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_68,"Failed to set PTHREAD_PROCESS_SHARED to barrierattr: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  this_00 = std::
            unique_ptr<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
            ::operator->(&this->barrier_);
  __barrier = SharedMemoryObject<pthread_barrier_t>::get(this_00);
  iVar1 = pthread_barrier_init((pthread_barrier_t *)__barrier,&local_18,local_14);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_88,"Failed to initialize barrier: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  iVar1 = pthread_barrierattr_destroy(&local_18);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_a8,"Failed to destroy barrierattr: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_a8);
    iVar1 = std::__cxx11::string::~string((string *)&local_a8);
  }
  return iVar1;
}

Assistant:

void SharedBarrier::init(uint32_t count) {
    pthread_barrierattr_t barrierattr;
    if (pthread_barrierattr_init(&barrierattr) != 0) {
        die(format("Failed to initialize barrierattr: %m"));
    }
    if (pthread_barrierattr_setpshared(&barrierattr, PTHREAD_PROCESS_SHARED) != 0) {
        die(format("Failed to set PTHREAD_PROCESS_SHARED to barrierattr: %m"));
    }
    if (pthread_barrier_init(barrier_->get(), &barrierattr, count)) {
        die(format("Failed to initialize barrier: %m"));
    }
    if (pthread_barrierattr_destroy(&barrierattr) != 0) {
        die(format("Failed to destroy barrierattr: %m"));
    }
}